

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O2

int testUnidimDcmBiasEstimator(int errorCode)

{
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pCVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  double dVar9;
  double local_518;
  vector<double,_std::allocator<double>_> dcm;
  vector<double,_std::allocator<double>_> bias;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_4d0;
  vector<double,_std::allocator<double>_> bias_hat;
  vector<double,_std::allocator<double>_> dcm_hat;
  vector<double,_std::allocator<double>_> zmp_m;
  vector<double,_std::allocator<double>_> dcm_m;
  vector<double,_std::allocator<double>_> zmp;
  vector<double,_std::allocator<double>_> dcm_m_unbiased;
  IndexedVectorArray log;
  Vector6 log_k;
  UnidimLipmDcmEstimator est;
  LinearKalmanFilter local_370 [832];
  
  std::vector<double,_std::allocator<double>_>::vector(&dcm,24000,(allocator_type *)&est);
  std::vector<double,_std::allocator<double>_>::vector(&bias,24000,(allocator_type *)&est);
  std::vector<double,_std::allocator<double>_>::vector(&zmp,24000,(allocator_type *)&est);
  dVar5 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(2.0,0.0);
  *dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = dVar5;
  dVar5 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.01,0.0);
  *bias.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = dVar5;
  dVar5 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
  dVar9 = *dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start * 1.6060915267313265 + dVar5;
  *zmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = dVar9;
  for (lVar3 = 0; lVar3 != 23999; lVar3 = lVar3 + 1) {
    dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3 + 1] = (dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3] - dVar9) * 0.01649915822768611 +
                  dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3];
    dVar9 = bias.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar3];
    dVar6 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                              (2.5e-05,0.0);
    bias.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3 + 1] = dVar9 + dVar6;
    dVar6 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
    dVar9 = dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar3];
    dVar7 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
    dVar5 = dVar5 + dVar6;
    dVar9 = dVar9 * 1.6060915267313265 + dVar7 + dVar5;
    zmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3 + 1] = dVar9;
  }
  std::vector<double,_std::allocator<double>_>::vector(&dcm_m_unbiased,24000,(allocator_type *)&est)
  ;
  std::vector<double,_std::allocator<double>_>::vector(&dcm_m,24000,(allocator_type *)&est);
  std::vector<double,_std::allocator<double>_>::vector(&zmp_m,24000,(allocator_type *)&est);
  for (lVar3 = 0; lVar3 != 24000; lVar3 = lVar3 + 1) {
    dVar5 = dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar3];
    dVar9 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.005,0.0);
    dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = dVar5 + dVar9;
    dcm_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] =
         dVar5 + dVar9 +
         bias.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar3];
    dVar5 = zmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar3];
    dVar9 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.001,0.0);
    zmp_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = dVar5 + dVar9;
  }
  std::vector<double,_std::allocator<double>_>::vector(&dcm_hat,24000,(allocator_type *)&est);
  std::vector<double,_std::allocator<double>_>::vector(&bias_hat,24000,(allocator_type *)&est);
  stateObservation::UnidimLipmDcmEstimator::UnidimLipmDcmEstimator
            (&est,0.005,3.2998316455372216,0.002,0.0,0.0,0.0,0.01,0.005,0.01,0.01);
  iVar4 = 1;
  stateObservation::UnidimLipmDcmEstimator::resetWithInputs
            (*dcm_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,
             *zmp_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,SUB81(&est,0),0.005,0.001,0.0,0.01,0.01);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&log);
  for (lVar3 = 0; lVar3 != 0x2edf8; lVar3 = lVar3 + 8) {
    stateObservation::UnidimLipmDcmEstimator::setInputs
              (*(double *)
                ((long)dcm_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3 + 8),
               *(double *)
                ((long)zmp_m.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3 + 8));
    stateObservation::UnidimLipmDcmEstimator::update((UnidimLipmDcmEstimator *)&log_k);
    uVar8 = stateObservation::UnidimLipmDcmEstimator::getBias();
    *(undefined8 *)
     ((long)bias_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3 + 8) = uVar8;
    dVar5 = (double)stateObservation::UnidimLipmDcmEstimator::getUnbiasedDCM();
    *(double *)
     ((long)dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3 + 8) = dVar5;
    if (NAN(dVar5)) goto LAB_00103a97;
    log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (double)iVar4;
    local_4d0.m_row = 0;
    local_4d0.m_col = 1;
    local_4d0.m_currentBlockRows = 1;
    local_4d0.m_xpr = (Matrix<double,_6,_1,_0,_6,_1> *)&log_k;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (&local_4d0,
                        (Scalar *)
                        ((long)bias_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3 + 8));
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar1,(Scalar *)
                               ((long)bias.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar3 + 8));
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar1,(Scalar *)
                               ((long)dcm_hat.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar3 + 8));
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar1,(Scalar *)
                               ((long)dcm_m_unbiased.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3 + 8));
    Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
              (pCVar1,(Scalar *)
                      ((long)dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3 + 8));
    Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::finished(&local_4d0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_4d0,
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&log_k);
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&log.v_,(value_type *)&local_4d0);
    free(local_4d0.m_xpr);
    iVar4 = iVar4 + 1;
  }
  local_518 = 0.0;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    local_518 = local_518 +
                ABS(bias_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3 + 0x5db6] -
                    bias.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3 + 0x5db6]) +
                ABS(dcm_hat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3 + 0x5db6] -
                    dcm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar3 + 0x5db6]);
  }
  std::operator<<((ostream *)&std::cout,"Sum of error on the 10 last samples = ");
  poVar2 = std::ostream::_M_insert<double>(local_518);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (local_518 <= 0.07) {
    errorCode = 0;
  }
LAB_00103a97:
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque(&log.v_);
  stateObservation::LinearKalmanFilter::~LinearKalmanFilter(local_370);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bias_hat.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dcm_hat.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&zmp_m.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dcm_m.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dcm_m_unbiased.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&zmp.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bias.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dcm.super__Vector_base<double,_std::allocator<double>_>);
  return errorCode;
}

Assistant:

int testUnidimDcmBiasEstimator(int errorCode)
{
  double w0 = sqrt(cst::gravityConstant / 0.9);
  double dt = 0.005;

  double biasDriftPerSecondStd = 0.005;
  double zmpMeasurementErrorStd = 0.001;
  double dcmMeasurementErrorStd = 0.005;

  int signallength = int(120. / dt);

  ///////////////////////////////////////
  /// Build the ground truth signals
  ///////////////////////////////////////
  typedef tools::ProbabilityLawSimulation ran;
  std::vector<double> dcm(signallength), bias(signallength), zmp(signallength);

  /// set the desired exponential convergence of the DCM
  double lambda = 2;

  /// initialize the dcm and bias to a random value
  dcm[0] = ran::getGaussianScalar(2, 0);
  double initBiasstd = 0.01;

  bias[0] = ran::getGaussianScalar(0.01, 0);
  double deviation = ran::getGaussianScalar(0.05, 0);
  zmp[0] = (lambda / w0 + 1) * dcm[0] + deviation;

  for(int i = 0; i < signallength - 1; ++i)
  {
    /// dcm dynamics
    dcm[i + 1] = dcm[i] + dt * w0 * (dcm[i] - zmp[i]);
    /// drift
    bias[i + 1] = bias[i] + ran::getGaussianScalar(biasDriftPerSecondStd * dt);
    /// set a noisy zmp to create  bounded drift of the DCM
    deviation += ran::getGaussianScalar(0.05, 0);
    zmp[i + 1] = (lambda / w0 + 1) * dcm[i] + ran::getGaussianScalar(0.05, 0) + deviation;
  }

  /////////////////////////////////
  /// Build the measurements
  /////////////////////////////////
  std::vector<double> dcm_m_unbiased(signallength), dcm_m(signallength), zmp_m(signallength);

  for(int i = 0; i < signallength; ++i)
  {
    dcm_m_unbiased[i] = dcm[i] + ran::getGaussianScalar(dcmMeasurementErrorStd);
    dcm_m[i] = dcm_m_unbiased[i] + bias[i];
    zmp_m[i] = zmp[i] + ran::getGaussianScalar(zmpMeasurementErrorStd);
  }

  /////////////////////////////////
  /// Run the estimator
  /////////////////////////////////
  std::vector<double> dcm_hat(signallength), bias_hat(signallength);

  double initbias = 0;

  UnidimLipmDcmEstimator est(dt, w0);

  est.resetWithInputs(dcm_m[0], zmp_m[0], biasDriftPerSecondStd, dcmMeasurementErrorStd, zmpMeasurementErrorStd,
                      initbias, initBiasstd);

  IndexedVectorArray log;

  for(int i = 1; i < signallength; i++)
  {
    est.setInputs(dcm_m[i], zmp_m[i]);
    est.update();
    bias_hat[i] = est.getBias();
    dcm_hat[i] = est.getUnbiasedDCM();

    /// NaN detection
    if(dcm_hat[i] != dcm_hat[i])
    {
      return errorCode;
    }

    Vector6 log_k;

    log_k << i, bias_hat[i], bias[i], dcm_hat[i], dcm_m_unbiased[i], dcm[i];
    log.pushBack(log_k);
  }

  /// uncomment the following line to have a bit of a log
  // log.writeInFile("dcm.txt");

  /////////////////////////////////
  /// Check the rror
  /////////////////////////////////
  double error = 0;

  for(int i = signallength - 10; i < signallength; ++i)
  {
    error += fabs(dcm_hat[i] - dcm[i]) + fabs(bias_hat[i] - bias[i]);
  }

  std::cout << "Sum of error on the 10 last samples = " << error << std::endl;

  if(error > 0.07)
  {
    return errorCode;
  }
  else
  {
    return 0;
  }
}